

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtlsbackend.cpp
# Opt level: O1

void QTlsBackend::setupClientPskAuth
               (QSslPreSharedKeyAuthenticator *auth,char *hint,int hintLength,uint maxIdentityLen,
               uint maxPskLen)

{
  QSslPreSharedKeyAuthenticatorPrivate *pQVar1;
  QArrayData *pQVar2;
  
  if (hint != (char *)0x0) {
    pQVar1 = (auth->d).d.ptr;
    if ((pQVar1 != (QSslPreSharedKeyAuthenticatorPrivate *)0x0) &&
       ((__atomic_base<int>)
        *(__int_type *)
         &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value != (__atomic_base<int>)0x1)) {
      QSharedDataPointer<QSslPreSharedKeyAuthenticatorPrivate>::detach_helper(&auth->d);
    }
    pQVar1 = (auth->d).d.ptr;
    pQVar2 = &((pQVar1->identityHint).d.d)->super_QArrayData;
    (pQVar1->identityHint).d.d = (Data *)0x0;
    (pQVar1->identityHint).d.ptr = hint;
    (pQVar1->identityHint).d.size = (long)hintLength;
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar2,1,0x10);
      }
    }
  }
  pQVar1 = (auth->d).d.ptr;
  if ((pQVar1 != (QSslPreSharedKeyAuthenticatorPrivate *)0x0) &&
     ((__atomic_base<int>)
      *(__int_type *)
       &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value != (__atomic_base<int>)0x1)) {
    QSharedDataPointer<QSslPreSharedKeyAuthenticatorPrivate>::detach_helper(&auth->d);
  }
  pQVar1 = (auth->d).d.ptr;
  pQVar1->maximumIdentityLength = maxIdentityLen - 1;
  if ((pQVar1 != (QSslPreSharedKeyAuthenticatorPrivate *)0x0) &&
     ((__atomic_base<int>)
      *(__int_type *)
       &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value != (__atomic_base<int>)0x1)) {
    QSharedDataPointer<QSslPreSharedKeyAuthenticatorPrivate>::detach_helper(&auth->d);
  }
  ((auth->d).d.ptr)->maximumPreSharedKeyLength = maxPskLen;
  return;
}

Assistant:

void QTlsBackend::setupClientPskAuth(QSslPreSharedKeyAuthenticator *auth, const char *hint,
                                     int hintLength, unsigned maxIdentityLen, unsigned maxPskLen)
{
    Q_ASSERT(auth);
#if QT_CONFIG(ssl)
    if (hint)
        auth->d->identityHint = QByteArray::fromRawData(hint, hintLength); // it's NUL terminated, but do not include the NUL

    auth->d->maximumIdentityLength = int(maxIdentityLen) - 1; // needs to be NUL terminated
    auth->d->maximumPreSharedKeyLength = int(maxPskLen);
#else
    Q_UNUSED(auth);
    Q_UNUSED(hint);
    Q_UNUSED(hintLength);
    Q_UNUSED(maxIdentityLen);
    Q_UNUSED(maxPskLen);
#endif
}